

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_stats.cpp
# Opt level: O2

void duckdb::StringStats::Update(BaseStatistics *stats,string_t *value)

{
  data_t *comparison;
  uint uVar1;
  int iVar2;
  UnicodeType UVar3;
  InvalidInputException *__return_storage_ptr__;
  char *s;
  idx_t i;
  size_t __n;
  ulong len;
  allocator local_71;
  data_t target [8];
  string local_68;
  string local_48;
  
  uVar1 = (value->value).pointer.length;
  len = (ulong)uVar1;
  if (len < 0xd) {
    s = (value->value).pointer.prefix;
  }
  else {
    s = (value->value).pointer.ptr;
  }
  __n = 8;
  if (len < 8) {
    __n = len;
  }
  switchD_016b0717::default(target,s,__n);
  for (; __n != 8; __n = __n + 1) {
    target[__n] = '\0';
  }
  iVar2 = StringValueComparison(target,8,(const_data_ptr_t)&stats->stats_union);
  if (iVar2 < 0) {
    *&(stats->stats_union).string_data.min = target;
  }
  comparison = (stats->stats_union).string_data.max;
  iVar2 = StringValueComparison(target,8,comparison);
  if (0 < iVar2) {
    *(data_t (*) [8])comparison = target;
  }
  if ((stats->stats_union).string_data.max_string_length < uVar1) {
    (stats->stats_union).string_data.max_string_length = uVar1;
  }
  if (((stats->type).id_ == VARCHAR) && ((stats->stats_union).string_data.has_unicode == false)) {
    UVar3 = Utf8Proc::Analyze(s,len,(UnicodeInvalidReason *)0x0,(size_t *)0x0);
    if (UVar3 == UNICODE) {
      (stats->stats_union).string_data.has_unicode = true;
    }
    else if (UVar3 == INVALID) {
      __return_storage_ptr__ = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,s,s + len);
      ::std::__cxx11::string::string((string *)&local_48,"segment statistics update",&local_71);
      ErrorManager::InvalidUnicodeError(__return_storage_ptr__,&local_68,&local_48);
      __cxa_throw(__return_storage_ptr__,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void StringStats::Update(BaseStatistics &stats, const string_t &value) {
	auto data = const_data_ptr_cast(value.GetData());
	auto size = value.GetSize();

	//! we can only fit 8 bytes, so we might need to trim our string
	// construct the value
	data_t target[StringStatsData::MAX_STRING_MINMAX_SIZE];
	ConstructValue(data, size, target);

	// update the min and max
	auto &string_data = StringStats::GetDataUnsafe(stats);
	if (StringValueComparison(target, StringStatsData::MAX_STRING_MINMAX_SIZE, string_data.min) < 0) {
		memcpy(string_data.min, target, StringStatsData::MAX_STRING_MINMAX_SIZE);
	}
	if (StringValueComparison(target, StringStatsData::MAX_STRING_MINMAX_SIZE, string_data.max) > 0) {
		memcpy(string_data.max, target, StringStatsData::MAX_STRING_MINMAX_SIZE);
	}
	if (size > string_data.max_string_length) {
		string_data.max_string_length = UnsafeNumericCast<uint32_t>(size);
	}
	if (stats.GetType().id() == LogicalTypeId::VARCHAR && !string_data.has_unicode) {
		auto unicode = Utf8Proc::Analyze(const_char_ptr_cast(data), size);
		if (unicode == UnicodeType::UNICODE) {
			string_data.has_unicode = true;
		} else if (unicode == UnicodeType::INVALID) {
			throw ErrorManager::InvalidUnicodeError(string(const_char_ptr_cast(data), size),
			                                        "segment statistics update");
		}
	}
}